

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

Test * __thiscall
testing::internal::
TestFactoryImpl<(anonymous_namespace)::ktxTexture1WriteKTX2TestRGBA8_Write1DNoWriterMetadata_Test>::
CreateTest(TestFactoryImpl<(anonymous_namespace)::ktxTexture1WriteKTX2TestRGBA8_Write1DNoWriterMetadata_Test>
           *this)

{
  ktxTexture1WriteTestBase<unsigned_char,_4U,_32856U> *this_00;
  
  this_00 = (ktxTexture1WriteTestBase<unsigned_char,_4U,_32856U> *)operator_new(0x188);
  anon_unknown.dwarf_bfba::ktxTexture1WriteTestBase<unsigned_char,_4U,_32856U>::
  ktxTexture1WriteTestBase(this_00);
  *(undefined4 *)&this_00[1].super_Test._vptr_Test = 4;
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__ktxTexture1WriteTestBase_0019c170;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override { return new TestClass; }